

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::GetToken(Parser *this)

{
  int iVar1;
  Token *this_00;
  Token temp;
  Token TStack_58;
  
  Lexer::Get(&TStack_58,&this->lexer);
  if (TStack_58.type._M_string_length == _DAT_0011ad18) {
    if (TStack_58.type._M_string_length != 0) {
      iVar1 = bcmp(TStack_58.type._M_dataplus._M_p,(anonymous_namespace)::WHITESPACE_abi_cxx11_,
                   TStack_58.type._M_string_length);
      if (iVar1 != 0) goto LAB_0010f94b;
    }
  }
  else {
LAB_0010f94b:
    if (TStack_58.type._M_string_length != DAT_0011ad38) {
LAB_0010f971:
      this_00 = (Token *)operator_new(0x48);
      Token::Token(this_00,&TStack_58);
      this->token = this_00;
      goto LAB_0010f99a;
    }
    if (TStack_58.type._M_string_length != 0) {
      iVar1 = bcmp(TStack_58.type._M_dataplus._M_p,(anonymous_namespace)::COMMENT_abi_cxx11_,
                   TStack_58.type._M_string_length);
      if (iVar1 != 0) goto LAB_0010f971;
    }
  }
  GetToken(this);
LAB_0010f99a:
  Token::~Token(&TStack_58);
  return;
}

Assistant:

void Parser::GetToken()
{
	Token temp = lexer.Get();

	if (temp.type != WHITESPACE && temp.type != COMMENT)
		token = new Token(temp);
	else
		GetToken();
}